

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_combo_separator(nk_context *ctx,char *items_separated_by_separator,int separator,int selected
                      ,int count,int item_height,nk_vec2 size)

{
  nk_vec2 nVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  nk_vec2 nVar5;
  float local_70;
  int local_64;
  char *pcStack_60;
  int length;
  char *iter;
  char *current_item;
  nk_vec2 window_padding;
  nk_vec2 item_spacing;
  int max_height;
  int i;
  int item_height_local;
  int count_local;
  int selected_local;
  int separator_local;
  char *items_separated_by_separator_local;
  nk_context *ctx_local;
  float fStack_10;
  nk_vec2 size_local;
  
  local_64 = 0;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x6274,
                  "int nk_combo_separator(struct nk_context *, const char *, int, int, int, int, struct nk_vec2)"
                 );
  }
  if (items_separated_by_separator == (char *)0x0) {
    __assert_fail("items_separated_by_separator",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x6275,
                  "int nk_combo_separator(struct nk_context *, const char *, int, int, int, int, struct nk_vec2)"
                 );
  }
  size_local.x = (float)selected;
  if ((ctx != (nk_context *)0x0) && (items_separated_by_separator != (char *)0x0)) {
    nVar1 = (ctx->style).window.spacing;
    nVar5 = nk_panel_get_padding(&ctx->style,ctx->current->layout->type);
    window_padding.y = nVar1.y;
    current_item._4_4_ = nVar5.y;
    iVar2 = (int)window_padding.y * 2 + (int)current_item._4_4_ * 2 +
            count * item_height + count * (int)window_padding.y;
    fStack_10 = size.y;
    if ((float)iVar2 <= fStack_10) {
      local_70 = (float)iVar2;
    }
    else {
      local_70 = fStack_10;
    }
    ctx_local._4_4_ = size.x;
    fStack_10 = local_70;
    iter = items_separated_by_separator;
    for (item_spacing.y = 0.0; (int)item_spacing.y < count;
        item_spacing.y = (float)((int)item_spacing.y + 1)) {
      pcStack_60 = iter;
      while( true ) {
        bVar4 = false;
        if (*pcStack_60 != '\0') {
          bVar4 = *pcStack_60 != separator;
        }
        if (!bVar4) break;
        pcStack_60 = pcStack_60 + 1;
      }
      local_64 = (int)pcStack_60 - (int)iter;
      if (item_spacing.y == (float)selected) break;
      iter = pcStack_60 + 1;
    }
    iVar2 = nk_combo_begin_text(ctx,iter,local_64,stack0xffffffffffffffec);
    item_height_local = selected;
    if (iVar2 != 0) {
      nk_layout_row_dynamic(ctx,(float)item_height,1);
      iter = items_separated_by_separator;
      for (item_spacing.y = 0.0; (int)item_spacing.y < count;
          item_spacing.y = (float)((int)item_spacing.y + 1)) {
        pcStack_60 = iter;
        while( true ) {
          bVar4 = false;
          if (*pcStack_60 != '\0') {
            bVar4 = *pcStack_60 != separator;
          }
          if (!bVar4) break;
          pcStack_60 = pcStack_60 + 1;
        }
        iVar2 = (int)pcStack_60 - (int)iter;
        iVar3 = nk_combo_item_text(ctx,iter,iVar2,0x11);
        if (iVar3 != 0) {
          item_height_local = (int)item_spacing.y;
        }
        iter = iter + (long)iVar2 + 1;
      }
      nk_combo_end(ctx);
    }
    size_local.x = (float)item_height_local;
  }
  return (int)size_local.x;
}

Assistant:

NK_API int
nk_combo_separator(struct nk_context *ctx, const char *items_separated_by_separator,
    int separator, int selected, int count, int item_height, struct nk_vec2 size)
{
    int i;
    int max_height;
    struct nk_vec2 item_spacing;
    struct nk_vec2 window_padding;
    const char *current_item;
    const char *iter;
    int length = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(items_separated_by_separator);
    if (!ctx || !items_separated_by_separator)
        return selected;

    /* calculate popup window */
    item_spacing = ctx->style.window.spacing;
    window_padding = nk_panel_get_padding(&ctx->style, ctx->current->layout->type);
    max_height = count * item_height + count * (int)item_spacing.y;
    max_height += (int)item_spacing.y * 2 + (int)window_padding.y * 2;
    size.y = NK_MIN(size.y, (float)max_height);

    /* find selected item */
    current_item = items_separated_by_separator;
    for (i = 0; i < count; ++i) {
        iter = current_item;
        while (*iter && *iter != separator) iter++;
        length = (int)(iter - current_item);
        if (i == selected) break;
        current_item = iter + 1;
    }

    if (nk_combo_begin_text(ctx, current_item, length, size)) {
        current_item = items_separated_by_separator;
        nk_layout_row_dynamic(ctx, (float)item_height, 1);
        for (i = 0; i < count; ++i) {
            iter = current_item;
            while (*iter && *iter != separator) iter++;
            length = (int)(iter - current_item);
            if (nk_combo_item_text(ctx, current_item, length, NK_TEXT_LEFT))
                selected = i;
            current_item = current_item + length + 1;
        }
        nk_combo_end(ctx);
    }
    return selected;
}